

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_free_kv_var_test(void)

{
  char *__format;
  void *key;
  int v;
  timeval __test_begin;
  btree local_d8;
  btree_kv_ops local_98;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  btree_str_kv_get_kb64_vb64(&local_98);
  local_d8.vsize = '\x04';
  v = 1;
  key = malloc(0xd);
  *(undefined2 *)key = 0xb00;
  *(undefined8 *)((long)key + 2) = 0x6972747374736574;
  *(undefined4 *)((long)key + 9) = 0x676e69;
  (*local_98.free_kv_var)(&local_d8,&key,&v);
  if (key != (void *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x423);
    kv_free_kv_var_test()::__test_pass = '\x01';
    if (key != (void *)0x0) {
      __assert_fail("key == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x423,"void kv_free_kv_var_test()");
    }
  }
  (*local_98.free_kv_var)(&local_d8,&key,&v);
  if (key != (void *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x427);
    kv_free_kv_var_test()::__test_pass = '\x01';
    if (key != (void *)0x0) {
      __assert_fail("key == __null",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                    ,0x427,"void kv_free_kv_var_test()");
    }
  }
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_free_kv_var_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv_free_kv_var_test");
  return;
}

Assistant:

void kv_free_kv_var_test()
{
    TEST_INIT();
    memleak_start();

    btree_kv_ops *kv_ops;
    btree *tree;
    void *key;
    int v;
    char str[] = "teststring";

    kv_ops = alca(btree_kv_ops, 1);
    btree_str_kv_get_kb64_vb64(kv_ops);
    tree = alca(struct btree, 1);
    tree->vsize = sizeof(v);
    v = 1;
    construct_key_ptr(str, sizeof(str), &key);

    // free kv string
    kv_ops->free_kv_var(tree, &key, (void *)&v);
    TEST_CHK(key == NULL);

    // attempt double free
    kv_ops->free_kv_var(tree, &key, (void *)&v);
    TEST_CHK(key == NULL);

    memleak_end();
    TEST_RESULT("kv_free_kv_var_test");
}